

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::BinaryFunctionException::BinaryFunctionException
          (BinaryFunctionException *this,string *functionname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *functionname_local;
  BinaryFunctionException *this_local;
  
  local_18 = functionname;
  functionname_local = (string *)this;
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError =
       &PTR__BinaryFunctionException_00136828;
  std::operator+(&local_58,"Error: binary function [",local_18);
  std::operator+(&local_38,&local_58,"] must have two operator numbers: ");
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_38
            );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

BinaryFunctionException(const std::string& functionname) {
        error_msg = "Error: binary function [" + functionname +
                    "] must have two operator numbers: ";
    }